

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O2

void __thiscall CTcDataStream::write_prop_id(CTcDataStream *this,uint prop_id)

{
  if (G_keep_propfixups != 0) {
    CTcIdFixup::add_fixup(&G_propfixup,this,this->ofs_,(ulong)prop_id);
  }
  write2(this,prop_id);
  return;
}

Assistant:

void CTcDataStream::write_prop_id(uint prop_id)
{
    /* if there's an object ID fixup list, add this reference */
    if (G_keep_propfixups)
        CTcIdFixup::add_fixup(&G_propfixup, this, get_ofs(), prop_id);

    /* write the ID */
    write2(prop_id);
}